

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadEffectParam(ColladaParser *this,EffectParam *pParam)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  allocator local_59;
  string local_58;
  char *local_38;
  char *url;
  char *pcStack_28;
  int attrURL;
  char *content_1;
  char *content;
  EffectParam *pParam_local;
  ColladaParser *this_local;
  
  content = (char *)pParam;
  pParam_local = (EffectParam *)this;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            if ((uVar2 & 1) == 0) {
              return;
            }
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 1) break;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 2) {
              return;
            }
          }
          bVar1 = IsElement(this,"surface");
          if (!bVar1) break;
          TestOpening(this,"init_from");
          content_1 = GetTextContent(this);
          content[0] = '\x01';
          content[1] = '\0';
          content[2] = '\0';
          content[3] = '\0';
          std::__cxx11::string::operator=((string *)(content + 8),content_1);
          TestClosing(this,"init_from");
          SkipElement(this,"surface");
        }
        bVar1 = IsElement(this,"sampler2D");
        if ((!bVar1) || ((this->mFormat != FV_1_4_n && (this->mFormat != FV_1_3_n)))) break;
        TestOpening(this,"source");
        pcStack_28 = GetTextContent(this);
        content[0] = '\0';
        content[1] = '\0';
        content[2] = '\0';
        content[3] = '\0';
        std::__cxx11::string::operator=((string *)(content + 8),pcStack_28);
        TestClosing(this,"source");
        SkipElement(this,"sampler2D");
      }
      bVar1 = IsElement(this,"sampler2D");
      if (bVar1) break;
      SkipElement(this);
    }
    TestOpening(this,"instance_image");
    url._4_4_ = GetAttribute(this,"url");
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)url._4_4_);
    local_38 = (char *)CONCAT44(extraout_var,iVar3);
    if (*local_38 != '#') break;
    local_38 = local_38 + 1;
    content[0] = '\0';
    content[1] = '\0';
    content[2] = '\0';
    content[3] = '\0';
    std::__cxx11::string::operator=((string *)(content + 8),local_38);
    SkipElement(this,"sampler2D");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,"Unsupported URL format in instance_image",&local_59);
  ThrowException(this,&local_58);
}

Assistant:

void ColladaParser::ReadEffectParam(Collada::EffectParam& pParam)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("surface"))
            {
                // image ID given inside <init_from> tags
                TestOpening("init_from");
                const char* content = GetTextContent();
                pParam.mType = Param_Surface;
                pParam.mReference = content;
                TestClosing("init_from");

                // don't care for remaining stuff
                SkipElement("surface");
            }
            else if (IsElement("sampler2D") && (FV_1_4_n == mFormat || FV_1_3_n == mFormat))
            {
                // surface ID is given inside <source> tags
                TestOpening("source");
                const char* content = GetTextContent();
                pParam.mType = Param_Sampler;
                pParam.mReference = content;
                TestClosing("source");

                // don't care for remaining stuff
                SkipElement("sampler2D");
            }
            else if (IsElement("sampler2D"))
            {
                // surface ID is given inside <instance_image> tags
                TestOpening("instance_image");
                int attrURL = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrURL);
                if (url[0] != '#')
                    ThrowException("Unsupported URL format in instance_image");
                url++;
                pParam.mType = Param_Sampler;
                pParam.mReference = url;
                SkipElement("sampler2D");
            }
            else
            {
                // ignore unknown element
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}